

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ActivationParams::MergeFrom(ActivationParams *this,ActivationParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ActivationSoftsign *pAVar3;
  ActivationLeakyReLU *pAVar4;
  ActivationSigmoidHard *pAVar5;
  ActivationTanh *pAVar6;
  ActivationParametricSoftplus *pAVar7;
  ActivationELU *pAVar8;
  ActivationSoftplus *pAVar9;
  ActivationScaledTanh *pAVar10;
  ActivationSigmoid *pAVar11;
  ActivationLinear *pAVar12;
  ActivationThresholdedReLU *pAVar13;
  ActivationReLU *pAVar14;
  ActivationPReLU *pAVar15;
  ActivationELU *from_00;
  ActivationSoftplus *from_01;
  ActivationScaledTanh *from_02;
  ActivationSoftsign *from_03;
  ActivationParametricSoftplus *from_04;
  ActivationSigmoid *from_05;
  ActivationLinear *from_06;
  ActivationThresholdedReLU *from_07;
  ActivationReLU *from_08;
  ActivationPReLU *from_09;
  ActivationSigmoidHard *from_10;
  ActivationLeakyReLU *from_11;
  ActivationTanh *from_12;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1977);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 0x1f) {
    if ((int)uVar1 < 0x14) {
      if (uVar1 == 5) {
        if (this->_oneof_case_[0] != 5) {
          clear_NonlinearityType(this);
          this->_oneof_case_[0] = 5;
          pAVar12 = (ActivationLinear *)operator_new(0x20);
          ActivationLinear::ActivationLinear(pAVar12);
          (this->NonlinearityType_).linear_ = pAVar12;
        }
        pAVar12 = (this->NonlinearityType_).linear_;
        if (from->_oneof_case_[0] == 5) {
          from_06 = (from->NonlinearityType_).linear_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_06 = (ActivationLinear *)&_ActivationLinear_default_instance_;
        }
        ActivationLinear::MergeFrom(pAVar12,from_06);
      }
      else if (uVar1 == 10) {
        if (this->_oneof_case_[0] != 10) {
          clear_NonlinearityType(this);
          this->_oneof_case_[0] = 10;
          pAVar14 = (ActivationReLU *)operator_new(0x18);
          ActivationReLU::ActivationReLU(pAVar14);
          (this->NonlinearityType_).relu_ = pAVar14;
        }
        pAVar14 = (this->NonlinearityType_).relu_;
        if (from->_oneof_case_[0] == 10) {
          from_08 = (from->NonlinearityType_).relu_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_08 = (ActivationReLU *)&_ActivationReLU_default_instance_;
        }
        ActivationReLU::MergeFrom(pAVar14,from_08);
      }
      else if (uVar1 == 0xf) {
        if (this->_oneof_case_[0] != 0xf) {
          clear_NonlinearityType(this);
          this->_oneof_case_[0] = 0xf;
          pAVar4 = (ActivationLeakyReLU *)operator_new(0x18);
          ActivationLeakyReLU::ActivationLeakyReLU(pAVar4);
          (this->NonlinearityType_).leakyrelu_ = pAVar4;
        }
        pAVar4 = (this->NonlinearityType_).leakyrelu_;
        if (from->_oneof_case_[0] == 0xf) {
          from_11 = (from->NonlinearityType_).leakyrelu_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_11 = (ActivationLeakyReLU *)&_ActivationLeakyReLU_default_instance_;
        }
        ActivationLeakyReLU::MergeFrom(pAVar4,from_11);
      }
    }
    else if (uVar1 == 0x14) {
      if (this->_oneof_case_[0] != 0x14) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x14;
        pAVar13 = (ActivationThresholdedReLU *)operator_new(0x18);
        ActivationThresholdedReLU::ActivationThresholdedReLU(pAVar13);
        (this->NonlinearityType_).thresholdedrelu_ = pAVar13;
      }
      pAVar13 = (this->NonlinearityType_).thresholdedrelu_;
      if (from->_oneof_case_[0] == 0x14) {
        from_07 = (from->NonlinearityType_).thresholdedrelu_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_07 = (ActivationThresholdedReLU *)&_ActivationThresholdedReLU_default_instance_;
      }
      ActivationThresholdedReLU::MergeFrom(pAVar13,from_07);
    }
    else if (uVar1 == 0x19) {
      if (this->_oneof_case_[0] != 0x19) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x19;
        pAVar15 = (ActivationPReLU *)operator_new(0x20);
        ActivationPReLU::ActivationPReLU(pAVar15);
        (this->NonlinearityType_).prelu_ = pAVar15;
      }
      pAVar15 = (this->NonlinearityType_).prelu_;
      if (from->_oneof_case_[0] == 0x19) {
        from_09 = (from->NonlinearityType_).prelu_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_09 = (ActivationPReLU *)&_ActivationPReLU_default_instance_;
      }
      ActivationPReLU::MergeFrom(pAVar15,from_09);
    }
    else if (uVar1 == 0x1e) {
      if (this->_oneof_case_[0] != 0x1e) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x1e;
        pAVar6 = (ActivationTanh *)operator_new(0x18);
        ActivationTanh::ActivationTanh(pAVar6);
        (this->NonlinearityType_).tanh_ = pAVar6;
      }
      pAVar6 = (this->NonlinearityType_).tanh_;
      if (from->_oneof_case_[0] == 0x1e) {
        from_12 = (from->NonlinearityType_).tanh_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_12 = (ActivationTanh *)&_ActivationTanh_default_instance_;
      }
      ActivationTanh::MergeFrom(pAVar6,from_12);
    }
  }
  else if ((int)uVar1 < 0x32) {
    if (uVar1 == 0x1f) {
      if (this->_oneof_case_[0] != 0x1f) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x1f;
        pAVar10 = (ActivationScaledTanh *)operator_new(0x20);
        ActivationScaledTanh::ActivationScaledTanh(pAVar10);
        (this->NonlinearityType_).scaledtanh_ = pAVar10;
      }
      pAVar10 = (this->NonlinearityType_).scaledtanh_;
      if (from->_oneof_case_[0] == 0x1f) {
        from_02 = (from->NonlinearityType_).scaledtanh_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_02 = (ActivationScaledTanh *)&_ActivationScaledTanh_default_instance_;
      }
      ActivationScaledTanh::MergeFrom(pAVar10,from_02);
    }
    else if (uVar1 == 0x28) {
      if (this->_oneof_case_[0] != 0x28) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x28;
        pAVar11 = (ActivationSigmoid *)operator_new(0x18);
        ActivationSigmoid::ActivationSigmoid(pAVar11);
        (this->NonlinearityType_).sigmoid_ = pAVar11;
      }
      pAVar11 = (this->NonlinearityType_).sigmoid_;
      if (from->_oneof_case_[0] == 0x28) {
        from_05 = (from->NonlinearityType_).sigmoid_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_05 = (ActivationSigmoid *)&_ActivationSigmoid_default_instance_;
      }
      ActivationSigmoid::MergeFrom(pAVar11,from_05);
    }
    else if (uVar1 == 0x29) {
      if (this->_oneof_case_[0] != 0x29) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x29;
        pAVar5 = (ActivationSigmoidHard *)operator_new(0x20);
        ActivationSigmoidHard::ActivationSigmoidHard(pAVar5);
        (this->NonlinearityType_).sigmoidhard_ = pAVar5;
      }
      pAVar5 = (this->NonlinearityType_).sigmoidhard_;
      if (from->_oneof_case_[0] == 0x29) {
        from_10 = (from->NonlinearityType_).sigmoidhard_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_10 = (ActivationSigmoidHard *)&_ActivationSigmoidHard_default_instance_;
      }
      ActivationSigmoidHard::MergeFrom(pAVar5,from_10);
    }
  }
  else if ((int)uVar1 < 0x46) {
    if (uVar1 == 0x32) {
      if (this->_oneof_case_[0] != 0x32) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x32;
        pAVar8 = (ActivationELU *)operator_new(0x18);
        ActivationELU::ActivationELU(pAVar8);
        (this->NonlinearityType_).elu_ = pAVar8;
      }
      pAVar8 = (this->NonlinearityType_).elu_;
      if (from->_oneof_case_[0] == 0x32) {
        from_00 = (from->NonlinearityType_).elu_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (ActivationELU *)&_ActivationELU_default_instance_;
      }
      ActivationELU::MergeFrom(pAVar8,from_00);
    }
    else if (uVar1 == 0x3c) {
      if (this->_oneof_case_[0] != 0x3c) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x3c;
        pAVar3 = (ActivationSoftsign *)operator_new(0x18);
        ActivationSoftsign::ActivationSoftsign(pAVar3);
        (this->NonlinearityType_).softsign_ = pAVar3;
      }
      pAVar3 = (this->NonlinearityType_).softsign_;
      if (from->_oneof_case_[0] == 0x3c) {
        from_03 = (from->NonlinearityType_).softsign_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_03 = (ActivationSoftsign *)&_ActivationSoftsign_default_instance_;
      }
      ActivationSoftsign::MergeFrom(pAVar3,from_03);
    }
  }
  else if (uVar1 == 0x46) {
    if (this->_oneof_case_[0] != 0x46) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x46;
      pAVar9 = (ActivationSoftplus *)operator_new(0x18);
      ActivationSoftplus::ActivationSoftplus(pAVar9);
      (this->NonlinearityType_).softplus_ = pAVar9;
    }
    pAVar9 = (this->NonlinearityType_).softplus_;
    if (from->_oneof_case_[0] == 0x46) {
      from_01 = (from->NonlinearityType_).softplus_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (ActivationSoftplus *)&_ActivationSoftplus_default_instance_;
    }
    ActivationSoftplus::MergeFrom(pAVar9,from_01);
  }
  else if (uVar1 == 0x47) {
    if (this->_oneof_case_[0] != 0x47) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x47;
      pAVar7 = (ActivationParametricSoftplus *)operator_new(0x28);
      ActivationParametricSoftplus::ActivationParametricSoftplus(pAVar7);
      (this->NonlinearityType_).parametricsoftplus_ = pAVar7;
    }
    pAVar7 = (this->NonlinearityType_).parametricsoftplus_;
    if (from->_oneof_case_[0] == 0x47) {
      from_04 = (from->NonlinearityType_).parametricsoftplus_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_04 = (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_;
    }
    ActivationParametricSoftplus::MergeFrom(pAVar7,from_04);
  }
  return;
}

Assistant:

void ActivationParams::MergeFrom(const ActivationParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ActivationParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.NonlinearityType_case()) {
    case kLinear: {
      mutable_linear()->::CoreML::Specification::ActivationLinear::MergeFrom(from.linear());
      break;
    }
    case kReLU: {
      mutable_relu()->::CoreML::Specification::ActivationReLU::MergeFrom(from.relu());
      break;
    }
    case kLeakyReLU: {
      mutable_leakyrelu()->::CoreML::Specification::ActivationLeakyReLU::MergeFrom(from.leakyrelu());
      break;
    }
    case kThresholdedReLU: {
      mutable_thresholdedrelu()->::CoreML::Specification::ActivationThresholdedReLU::MergeFrom(from.thresholdedrelu());
      break;
    }
    case kPReLU: {
      mutable_prelu()->::CoreML::Specification::ActivationPReLU::MergeFrom(from.prelu());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::ActivationTanh::MergeFrom(from.tanh());
      break;
    }
    case kScaledTanh: {
      mutable_scaledtanh()->::CoreML::Specification::ActivationScaledTanh::MergeFrom(from.scaledtanh());
      break;
    }
    case kSigmoid: {
      mutable_sigmoid()->::CoreML::Specification::ActivationSigmoid::MergeFrom(from.sigmoid());
      break;
    }
    case kSigmoidHard: {
      mutable_sigmoidhard()->::CoreML::Specification::ActivationSigmoidHard::MergeFrom(from.sigmoidhard());
      break;
    }
    case kELU: {
      mutable_elu()->::CoreML::Specification::ActivationELU::MergeFrom(from.elu());
      break;
    }
    case kSoftsign: {
      mutable_softsign()->::CoreML::Specification::ActivationSoftsign::MergeFrom(from.softsign());
      break;
    }
    case kSoftplus: {
      mutable_softplus()->::CoreML::Specification::ActivationSoftplus::MergeFrom(from.softplus());
      break;
    }
    case kParametricSoftplus: {
      mutable_parametricsoftplus()->::CoreML::Specification::ActivationParametricSoftplus::MergeFrom(from.parametricsoftplus());
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
}